

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O3

int __thiscall CCEXP::CCEXPMat<unsigned_char>::StoreData(CCEXPMat<unsigned_char> *this,FILE *fp)

{
  ulong uVar1;
  pointer pMVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  long lVar3;
  int iVar4;
  ulong uVar5;
  pointer pMVar6;
  uint64_t uVar7;
  uint64_t typeSize;
  uint64_t _maxRows64;
  uint64_t N;
  MVECTOR<unsigned_long> DPL;
  MVECTOR<unsigned_char> n;
  
  iVar4 = 0;
  if (this->IgnoreM == false) {
    if (fp == (FILE *)0x0) {
      iVar4 = -9999;
      CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x1a0,
                     "CCEXPMat::StoreData():: File pointer is NULL! (!%u!)");
    }
    else {
      N = (long)(this->data).
                super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->data).
                super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
      typeSize = 1;
      _maxRows64 = this->_maxRows;
      fwrite(this->name,1,0x40,(FILE *)fp);
      fwrite(this->type,1,0x40,(FILE *)fp);
      fwrite(&typeSize,8,1,(FILE *)fp);
      fwrite(&N,8,1,(FILE *)fp);
      fwrite(&_maxRows64,8,1,(FILE *)fp);
      uVar1 = this->_maxRows;
      uVar7 = N;
      if (uVar1 <= N) {
        uVar7 = uVar1;
      }
      uVar5 = (long)(this->data).
                    super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->data).
                    super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      N = uVar7;
      if (uVar7 < uVar5) {
        iVar4 = -9999;
        CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x1af,
                       "CCEXPMat::StoreData():: Table [%s] containing more Rows (=%zu) than MaxRows (=%zu)"
                       ,this->name,uVar5,uVar1);
        fclose((FILE *)fp);
      }
      else {
        iVar4 = 0;
        if (uVar7 != 0) {
          ns_MVECTOR::MVECTOR_Base::MVECTOR_Base(&DPL.super_MVECTOR_Base);
          DPL.elements._4_4_ = 0;
          DPL.mem_elements = 0;
          DPL.dbg = 0;
          DPL.pdata._0_4_ = 0;
          DPL.pdata._4_4_ = 0;
          DPL.elements._0_4_ = 0;
          DPL.step_elements = 0x400;
          DPL.step_elements_back = 0x2800;
          DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ns_MVECTOR::MVECTOR<unsigned_long>::resize(&DPL,uVar7);
          pMVar6 = (this->data).
                   super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pMVar2 = (this->data).
                   super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pMVar6 != pMVar2) {
            lVar3 = 0;
            do {
              ns_MVECTOR::MVECTOR<unsigned_char>::MVECTOR(&n,pMVar6);
              *(size_t *)(CONCAT44(DPL.pdata._4_4_,DPL.pdata._0_4_) + lVar3) = n.elements;
              ns_MVECTOR::MVECTOR<unsigned_char>::~MVECTOR(&n);
              pMVar6 = pMVar6 + 1;
              lVar3 = lVar3 + 8;
            } while (pMVar6 != pMVar2);
          }
          fwrite((void *)CONCAT44(DPL.pdata._4_4_,DPL.pdata._0_4_),8,uVar7,(FILE *)fp);
          this_00 = DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          iVar4 = 0;
          if (CONCAT44(DPL.pdata._4_4_,DPL.pdata._0_4_) != 0) {
            LOCK();
            ns_MVECTOR::MVECTOR_Base::Total_MVECTOR_Bytes =
                 ns_MVECTOR::MVECTOR_Base::Total_MVECTOR_Bytes + DPL.mem_elements * -8;
            UNLOCK();
            LOCK();
            *(size_t *)
             (ns_MVECTOR::MVECTOR_Base::Group_MVECTOR_Bytes +
             (long)DPL.super_MVECTOR_Base.GroupID * 8) =
                 *(long *)(ns_MVECTOR::MVECTOR_Base::Group_MVECTOR_Bytes +
                          (long)DPL.super_MVECTOR_Base.GroupID * 8) + DPL.mem_elements * -8;
            UNLOCK();
            DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
            }
            DPL.pdata._0_4_ = 0;
            DPL.pdata._4_4_ = 0;
            DPL.elements._0_4_ = 0;
            DPL.elements._4_4_ = 0;
            DPL.mem_elements = 0;
          }
          uVar7 = typeSize;
          pMVar6 = (this->data).
                   super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pMVar2 = (this->data).
                   super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pMVar6 != pMVar2) {
            do {
              ns_MVECTOR::MVECTOR<unsigned_char>::MVECTOR(&n,pMVar6);
              fwrite(n.pdata,uVar7,n.elements,(FILE *)fp);
              ns_MVECTOR::MVECTOR<unsigned_char>::~MVECTOR(&n);
              pMVar6 = pMVar6 + 1;
            } while (pMVar6 != pMVar2);
          }
          ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR(&DPL);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int CCEXPMat<T>::StoreData(FILE* fp) {
	if (IgnoreM) return 0;
	CECS_ERRI(CCEXPECS,fp == NULL,"CCEXPMat::StoreData():: File pointer is NULL! (!%u!)");

	uint64_t N = (uint64_t)data.size();
	uint64_t typeSize = (uint64_t)sizeof(T);
	uint64_t _maxRows64 = (uint64_t)_maxRows;

	fwrite(name,sizeof(char),64,fp); /// Table, Name
	fwrite(type,sizeof(char),64,fp); /// Table, Type (string)
	fwrite(&typeSize,sizeof(uint64_t),1,fp); /// Table, type size in Bytes
	fwrite(&N,sizeof(uint64_t),1,fp); /// Table, number of rows
	fwrite(&_maxRows64,sizeof(uint64_t),1,fp); /// Maximum rows of the table.
	if (N > _maxRows) N = _maxRows; /// Limit Rows ...

	CECS_ERRO(CCEXPECS,data.size() > N, {fclose(fp); return _CECS_DEFAULT_ERRID;},
			"CCEXPMat::StoreData():: Table [%s] containing more Rows (=" __ZU__ ") than MaxRows (=" __ZU__ ")",
			name, data.size(), _maxRows)

	if (N > 0) {
		MVECTOR<uint64_t> DPL; DPL.resize(N);
		int i = 0;
		for (MVECTOR<T> n : data) DPL[i++] = (uint64_t)n.size();
		fwrite(DPL.data(), sizeof(uint64_t), N, fp);
		__CCEXP_VECTOR_CLEAR(DPL);
		for (MVECTOR<T> n : data) fwrite(n.data(), typeSize, n.size(), fp);
	}
	return 0;
}